

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsd.h
# Opt level: O0

int bsd_create_socket(int domain,int type,int protocol)

{
  int iVar1;
  int in_EDX;
  uint in_ESI;
  int in_EDI;
  int created_fd;
  int flags;
  
  iVar1 = socket(in_EDI,in_ESI | 0x80800,in_EDX);
  apple_no_sigpipe(iVar1);
  iVar1 = bsd_set_nonblocking(0);
  return iVar1;
}

Assistant:

static inline LIBUS_SOCKET_DESCRIPTOR bsd_create_socket(int domain, int type, int protocol) {
    // returns INVALID_SOCKET on error
    int flags = 0;
#if defined(SOCK_CLOEXEC) && defined(SOCK_NONBLOCK)
    flags = SOCK_CLOEXEC | SOCK_NONBLOCK;
#endif

    LIBUS_SOCKET_DESCRIPTOR created_fd = socket(domain, type | flags, protocol);

    return bsd_set_nonblocking(apple_no_sigpipe(created_fd));
}